

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O3

void __thiscall re2::DFA::DFA(DFA *this,Prog *prog,MatchKind kind,int64 max_mem)

{
  Mutex *__rwlock;
  Mutex *__rwlock_00;
  Prog *pPVar1;
  int iVar2;
  long lVar3;
  Workq *pWVar4;
  int *piVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  string local_1e8;
  Mutex *local_1c8;
  StateSet *local_1c0;
  Mutex *local_1b8;
  LogMessage local_1b0;
  
  this->prog_ = prog;
  this->kind_ = kind;
  this->init_failed_ = false;
  __rwlock = &this->mutex_;
  iVar2 = pthread_rwlock_init((pthread_rwlock_t *)__rwlock,(pthread_rwlockattr_t *)0x0);
  if (iVar2 == 0) {
    __rwlock_00 = &this->cache_mutex_;
    this->q0_ = (Workq *)0x0;
    this->q1_ = (Workq *)0x0;
    this->astack_ = (int *)0x0;
    iVar2 = pthread_rwlock_init((pthread_rwlock_t *)__rwlock_00,(pthread_rwlockattr_t *)0x0);
    if (iVar2 == 0) {
      this->mem_budget_ = max_mem;
      local_1c0 = &this->state_cache_;
      (this->state_cache_)._M_h._M_buckets = &(this->state_cache_)._M_h._M_single_bucket;
      (this->state_cache_)._M_h._M_bucket_count = 1;
      (this->state_cache_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      (this->state_cache_)._M_h._M_element_count = 0;
      (this->state_cache_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      (this->state_cache_)._M_h._M_rehash_policy._M_next_resize = 0;
      (this->state_cache_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
      lVar3 = 0xf0;
      do {
        *(undefined8 *)((long)this + lVar3 + -8) = 0;
        *(undefined4 *)((long)&this->prog_ + lVar3) = 0xffffffff;
        lVar3 = lVar3 + 0x10;
      } while (lVar3 != 0x170);
      this->cache_warned_ = false;
      pPVar1 = this->prog_;
      iVar2 = pPVar1->size_;
      iVar8 = 0;
      if (this->kind_ == kLongestMatch) {
        iVar8 = iVar2;
      }
      iVar6 = pPVar1->inst_count_[3] + iVar8 + pPVar1->inst_count_[4] + pPVar1->inst_count_[6] + 1;
      this->nastack_ = iVar6;
      lVar3 = (max_mem - ((long)(iVar2 + iVar8) * 0x10 + (long)iVar6 * 4)) + -0x170;
      this->mem_budget_ = lVar3;
      local_1c8 = __rwlock;
      local_1b8 = __rwlock_00;
      if (lVar3 < 0) {
        LogMessage::LogMessage
                  (&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/dfa.cc",
                   0x1c9,0);
        StringPrintf_abi_cxx11_
                  (&local_1e8,"DFA out of memory: prog size %d mem %lld",
                   (ulong)(uint)this->prog_->size_,max_mem);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0.str_,local_1e8._M_dataplus._M_p,local_1e8._M_string_length)
        ;
      }
      else {
        this->state_budget_ = lVar3;
        if ((((long)iVar8 + (long)pPVar1->list_count_) * 4 + (long)pPVar1->bytemap_range_ * 8) *
            0x14 + 0x1e0 <= lVar3) {
          pWVar4 = (Workq *)operator_new(0x28);
          SparseSet::SparseSet((SparseSet *)pWVar4,iVar2 + iVar8);
          pWVar4->n_ = iVar2;
          pWVar4->maxmark_ = iVar8;
          pWVar4->nextmark_ = iVar2;
          pWVar4->last_was_mark_ = true;
          this->q0_ = pWVar4;
          pWVar4 = (Workq *)operator_new(0x28);
          iVar2 = this->prog_->size_;
          SparseSet::SparseSet((SparseSet *)pWVar4,iVar2 + iVar8);
          pWVar4->n_ = iVar2;
          pWVar4->maxmark_ = iVar8;
          pWVar4->nextmark_ = iVar2;
          pWVar4->last_was_mark_ = true;
          this->q1_ = pWVar4;
          uVar7 = 0xffffffffffffffff;
          if (-1 < (long)this->nastack_) {
            uVar7 = (long)this->nastack_ * 4;
          }
          piVar5 = (int *)operator_new__(uVar7);
          this->astack_ = piVar5;
          return;
        }
        LogMessage::LogMessage
                  (&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/dfa.cc",
                   0x1db,0);
        StringPrintf_abi_cxx11_
                  (&local_1e8,"DFA out of memory: prog size %d mem %lld",
                   (ulong)(uint)this->prog_->size_,max_mem);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0.str_,local_1e8._M_dataplus._M_p,local_1e8._M_string_length)
        ;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p);
      }
      LogMessage::~LogMessage(&local_1b0);
      this->init_failed_ = true;
      return;
    }
  }
  abort();
}

Assistant:

DFA::DFA(Prog* prog, Prog::MatchKind kind, int64 max_mem)
  : prog_(prog),
    kind_(kind),
    init_failed_(false),
    q0_(NULL),
    q1_(NULL),
    astack_(NULL),
    mem_budget_(max_mem),
    cache_warned_(false) {
  if (DebugDFA)
    fprintf(stderr, "\nkind %d\n%s\n", (int)kind_, prog_->DumpUnanchored().c_str());
  int nmark = 0;
  if (kind_ == Prog::kLongestMatch)
    nmark = prog_->size();
  // See DFA::AddToQueue() for why this is so.
  nastack_ = prog_->inst_count(kInstCapture) +
             prog_->inst_count(kInstEmptyWidth) +
             prog_->inst_count(kInstNop) +
             nmark + 1;  // + 1 for start inst

  // Account for space needed for DFA, q0, q1, astack.
  mem_budget_ -= sizeof(DFA);
  mem_budget_ -= (prog_->size() + nmark) *
                 (sizeof(int)+sizeof(int)) * 2;  // q0, q1
  mem_budget_ -= nastack_ * sizeof(int);  // astack
  if (mem_budget_ < 0) {
    LOG(INFO) << StringPrintf("DFA out of memory: prog size %d mem %lld",
                              prog_->size(), max_mem);
    init_failed_ = true;
    return;
  }

  state_budget_ = mem_budget_;

  // Make sure there is a reasonable amount of working room left.
  // At minimum, the search requires room for two states in order
  // to limp along, restarting frequently.  We'll get better performance
  // if there is room for a larger number of states, say 20.
  // Note that a state stores list heads only, so we use the program
  // list count for the upper bound, not the program size.
  int nnext = prog_->bytemap_range() + 1;  // + 1 for kByteEndText slot
  int64 one_state = sizeof(State) + nnext*sizeof(std::atomic<State*>) +
                    (prog_->list_count()+nmark)*sizeof(int);
  if (state_budget_ < 20*one_state) {
    LOG(INFO) << StringPrintf("DFA out of memory: prog size %d mem %lld",
                              prog_->size(), max_mem);
    init_failed_ = true;
    return;
  }

  q0_ = new Workq(prog_->size(), nmark);
  q1_ = new Workq(prog_->size(), nmark);
  astack_ = new int[nastack_];
}